

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

bool __thiscall zmq::stream_t::xhas_in(stream_t *this)

{
  byte bVar1;
  int iVar2;
  blob_t *this_00;
  msg_t *this_01;
  int *piVar3;
  char *pcVar4;
  metadata_t *pmVar5;
  void *__dest;
  uchar *__src;
  size_t __n;
  long in_RDI;
  metadata_t *metadata;
  char *errstr;
  blob_t *routing_id;
  int rc;
  pipe_t *pipe;
  metadata_t *in_stack_ffffffffffffffa8;
  msg_t *in_stack_ffffffffffffffb0;
  pipe_t **in_stack_ffffffffffffffc8;
  msg_t *in_stack_ffffffffffffffd0;
  fq_t *in_stack_ffffffffffffffd8;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x770) & 1) == 0) {
    iVar2 = fq_t::recvpipe(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                           in_stack_ffffffffffffffc8);
    if (iVar2 == 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pipe != NULL",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream.cpp"
              ,0xef);
      fflush(_stderr);
      zmq_abort((char *)0x2dd43e);
      bVar1 = msg_t::flags((msg_t *)(in_RDI + 0x7b8));
      if ((bVar1 & 1) != 0) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "(_prefetched_msg.flags () & msg_t::more) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream.cpp"
                ,0xf0);
        fflush(_stderr);
        zmq_abort((char *)0x2dd4ae);
      }
      this_00 = pipe_t::get_routing_id((pipe_t *)0x0);
      this_01 = (msg_t *)(in_RDI + 0x778);
      blob_t::size(this_00);
      iVar2 = msg_t::init_size(this_01,(size_t)in_stack_ffffffffffffffb0);
      if (iVar2 != 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream.cpp"
                ,0xf4);
        fflush(_stderr);
        zmq_abort((char *)0x2dd551);
      }
      pmVar5 = msg_t::metadata((msg_t *)(in_RDI + 0x7b8));
      if (pmVar5 != (metadata_t *)0x0) {
        msg_t::set_metadata(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      __dest = msg_t::data(this_01);
      __src = blob_t::data(this_00);
      __n = blob_t::size(this_00);
      memcpy(__dest,__src,__n);
      msg_t::set_flags((msg_t *)(in_RDI + 0x778),'\x01');
      *(undefined1 *)(in_RDI + 0x770) = 1;
      *(undefined1 *)(in_RDI + 0x771) = 0;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool zmq::stream_t::xhas_in ()
{
    //  We may already have a message pre-fetched.
    if (_prefetched)
        return true;

    //  Try to read the next message.
    //  The message, if read, is kept in the pre-fetch buffer.
    pipe_t *pipe = NULL;
    int rc = _fq.recvpipe (&_prefetched_msg, &pipe);
    if (rc != 0)
        return false;

    zmq_assert (pipe != NULL);
    zmq_assert ((_prefetched_msg.flags () & msg_t::more) == 0);

    const blob_t &routing_id = pipe->get_routing_id ();
    rc = _prefetched_routing_id.init_size (routing_id.size ());
    errno_assert (rc == 0);

    // forward metadata (if any)
    metadata_t *metadata = _prefetched_msg.metadata ();
    if (metadata)
        _prefetched_routing_id.set_metadata (metadata);

    memcpy (_prefetched_routing_id.data (), routing_id.data (),
            routing_id.size ());
    _prefetched_routing_id.set_flags (msg_t::more);

    _prefetched = true;
    _routing_id_sent = false;

    return true;
}